

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O2

bool Minisat::match_signature(char *path,int *sig)

{
  int iVar1;
  FILE *__stream;
  int *p;
  bool bVar2;
  
  __stream = fopen(path,"r");
  if (__stream == (FILE *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    for (; (bVar2 && (*sig != -1)); sig = sig + 1) {
      iVar1 = getc(__stream);
      bVar2 = iVar1 == *sig;
    }
    fclose(__stream);
  }
  return bVar2;
}

Assistant:

inline bool match_signature(const char *path, const int *sig)
{
    assert(path);
    FILE *tmp = fopen(path, "r");
    if (!tmp) return false;
    bool res = true;
    for (const int *p = sig; res && (*p != EOF); p++) res = (getc(tmp) == *p);
    fclose(tmp);
    return res;
}